

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O2

RecycledSyncObject<VulkanUtilities::VkSemaphoreType> * __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
operator=(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this,
         RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *rhs)

{
  Release(this);
  std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *)
             this,(__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                   *)rhs);
  this->m_VkSyncObject = rhs->m_VkSyncObject;
  this->m_IsUnsignaled = rhs->m_IsUnsignaled;
  rhs->m_VkSyncObject = (NativeType)0x0;
  return this;
}

Assistant:

RecycledSyncObject& operator=(RecycledSyncObject&& rhs) noexcept
    {
        Release();
        m_pManager         = std::move(rhs.m_pManager);
        m_VkSyncObject     = rhs.m_VkSyncObject;
        m_IsUnsignaled     = rhs.m_IsUnsignaled;
        rhs.m_VkSyncObject = VK_NULL_HANDLE;
        return *this;
    }